

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O1

ssize_t __thiscall fmp4_stream::emsg::write(emsg *this,int __fd,void *__buf,size_t __n)

{
  ulong uVar1;
  pointer puVar2;
  size_type sVar3;
  size_type sVar4;
  uint uVar5;
  int iVar6;
  undefined4 in_register_00000034;
  char *pcVar7;
  char cVar8;
  char int_buf [4];
  char long_buf [8];
  uint local_3c;
  ulong local_38;
  
  pcVar7 = (char *)CONCAT44(in_register_00000034,__fd);
  uVar5 = (**(this->super_full_box).super_box._vptr_box)();
  local_3c = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  std::ostream::write(pcVar7,(long)&local_3c);
  cVar8 = (char)__fd;
  std::ostream::put(cVar8);
  std::ostream::put(cVar8);
  std::ostream::put(cVar8);
  std::ostream::put(cVar8);
  std::ostream::put(cVar8);
  std::ostream::put(cVar8);
  std::ostream::put(cVar8);
  std::ostream::put(cVar8);
  if ((this->super_full_box).super_box.field_0x62 == '\x01') {
    uVar5 = this->timescale_;
    local_3c = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    std::ostream::write(pcVar7,(long)&local_3c);
    uVar1 = this->presentation_time_;
    local_38 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18
               | (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 |
               (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
    std::ostream::write(pcVar7,(long)&local_38);
    uVar5 = this->event_duration_;
    local_3c = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    std::ostream::write(pcVar7,(long)&local_3c);
    uVar5 = this->id_;
    local_3c = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    std::ostream::write(pcVar7,(long)&local_3c);
    std::ostream::write(pcVar7,(long)(this->scheme_id_uri_)._M_dataplus._M_p);
    sVar3 = (this->scheme_id_uri_)._M_string_length;
    std::ostream::write(pcVar7,(long)(this->value_)._M_dataplus._M_p);
    iVar6 = (int)sVar3 + (int)(this->value_)._M_string_length + 0x22;
  }
  else {
    std::ostream::write(pcVar7,(long)(this->scheme_id_uri_)._M_dataplus._M_p);
    sVar3 = (this->scheme_id_uri_)._M_string_length;
    std::ostream::write(pcVar7,(long)(this->value_)._M_dataplus._M_p);
    sVar4 = (this->value_)._M_string_length;
    uVar5 = this->timescale_;
    local_3c = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    std::ostream::write(pcVar7,(long)&local_3c);
    uVar5 = this->presentation_time_delta_;
    local_3c = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    std::ostream::write(pcVar7,(long)&local_3c);
    uVar5 = this->event_duration_;
    local_3c = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    std::ostream::write(pcVar7,(long)&local_3c);
    uVar5 = this->id_;
    local_3c = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    std::ostream::write(pcVar7,(long)&local_3c);
    iVar6 = (int)sVar3 + (int)sVar4 + 0x1e;
  }
  puVar2 = (this->message_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->message_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar2) {
    std::ostream::write(pcVar7,(long)puVar2);
  }
  return (ulong)(uint)(iVar6 + (*(int *)&(this->message_data_).
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                               *(int *)&(this->message_data_).
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start));
}

Assistant:

uint32_t emsg::write(std::ostream &ostr) const
	{
		char int_buf[4];
		char long_buf[8];
		uint32_t bytes_written = 0;

		uint32_t sz = (uint32_t)this->size();
		fmp4_write_uint32(sz, int_buf);
		ostr.write((char *)int_buf, 4);
		bytes_written += 4;

		ostr.put('e');
		ostr.put('m');
		ostr.put('s');
		ostr.put('g');
		bytes_written += 4;
		ostr.put((uint8_t)version_);
		ostr.put(0u);
		ostr.put(0u);
		ostr.put(0u);
		bytes_written += 4;

		if (version_ == 1)
		{
			fmp4_write_uint32(timescale_, int_buf);
			ostr.write(int_buf, 4);
			bytes_written += 4;
			fmp4_write_uint64(presentation_time_, long_buf);
			ostr.write(long_buf, 8);
			bytes_written += 8;
			fmp4_write_uint32(event_duration_, int_buf);
			ostr.write(int_buf, 4);
			bytes_written += 4;
			fmp4_write_uint32(id_, int_buf);
			ostr.write(int_buf, 4);
			bytes_written += 4;
			ostr.write(scheme_id_uri_.c_str(), scheme_id_uri_.size() + 1);
			bytes_written += (uint32_t)scheme_id_uri_.size() + 1;
			ostr.write(value_.c_str(), value_.size() + 1);
			bytes_written += (uint32_t)value_.size() + 1;
		}
		else
		{
			ostr.write(scheme_id_uri_.c_str(), scheme_id_uri_.size() + 1);
			bytes_written += (uint32_t)scheme_id_uri_.size() + 1;
			ostr.write(value_.c_str(), value_.size() + 1);
			bytes_written += (uint32_t)value_.size() + 1;
			fmp4_write_uint32(timescale_, int_buf);
			ostr.write(int_buf, 4);
			bytes_written += 4;
			fmp4_write_uint32(presentation_time_delta_, int_buf);
			ostr.write(int_buf, 4);
			bytes_written += 4;
			fmp4_write_uint32(event_duration_, int_buf);
			ostr.write(int_buf, 4);
			bytes_written += 4;
			fmp4_write_uint32(id_, int_buf);
			ostr.write(int_buf, 4);
			bytes_written += 4;
		}
		if (message_data_.size())
			ostr.write((char *)&message_data_[0], message_data_.size());
		
		bytes_written += (uint32_t)message_data_.size();
		return bytes_written;
	}